

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t17(void)

{
  undefined8 in_RAX;
  long lVar1;
  undefined1 auVar2 [16];
  
  lVar1 = al_utf8_width(0);
  if (lVar1 == 1) {
    log_printf("OK   %s\n","al_utf8_width(0x000000) == 1");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x000000) == 1");
    error = error + 1;
  }
  lVar1 = al_utf8_width(0x7f);
  if (lVar1 == 1) {
    log_printf("OK   %s\n","al_utf8_width(0x00007f) == 1");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x00007f) == 1");
    error = error + 1;
  }
  lVar1 = al_utf8_width(0x80);
  if (lVar1 == 2) {
    log_printf("OK   %s\n","al_utf8_width(0x000080) == 2");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x000080) == 2");
    error = error + 1;
  }
  lVar1 = al_utf8_width(0x7ff);
  if (lVar1 == 2) {
    log_printf("OK   %s\n","al_utf8_width(0x0007ff) == 2");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x0007ff) == 2");
    error = error + 1;
  }
  lVar1 = al_utf8_width(0x800);
  if (lVar1 == 3) {
    log_printf("OK   %s\n","al_utf8_width(0x000800) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x000800) == 3");
    error = error + 1;
  }
  lVar1 = al_utf8_width(0xffff);
  if (lVar1 == 3) {
    log_printf("OK   %s\n","al_utf8_width(0x00ffff) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x00ffff) == 3");
    error = error + 1;
  }
  lVar1 = al_utf8_width(0x10000);
  if (lVar1 == 4) {
    log_printf("OK   %s\n","al_utf8_width(0x010000) == 4");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x010000) == 4");
    error = error + 1;
  }
  lVar1 = al_utf8_width(0x10ffff);
  if (lVar1 == 4) {
    log_printf("OK   %s\n","al_utf8_width(0x10ffff) == 4");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x10ffff) == 4");
    error = error + 1;
  }
  lVar1 = al_utf8_width(al_ustr_size);
  if (lVar1 == 0) {
    log_printf("OK   %s\n","al_utf8_width(0x110000) == 0");
  }
  else {
    log_printf("FAIL %s\n","al_utf8_width(0x110000) == 0");
    error = error + 1;
  }
  auVar2 = al_utf8_width(0xffffff);
  if (auVar2._0_8_ != 0) {
    log_printf("FAIL %s\n","al_utf8_width(0xffffff) == 0");
    error = error + 1;
    return;
  }
  log_printf("OK   %s\n","al_utf8_width(0xffffff) == 0",auVar2._8_8_,in_RAX);
  return;
}

Assistant:

static void t17(void)
{
   CHECK(al_utf8_width(0x000000) == 1);
   CHECK(al_utf8_width(0x00007f) == 1);
   CHECK(al_utf8_width(0x000080) == 2);
   CHECK(al_utf8_width(0x0007ff) == 2);
   CHECK(al_utf8_width(0x000800) == 3);
   CHECK(al_utf8_width(0x00ffff) == 3);
   CHECK(al_utf8_width(0x010000) == 4);
   CHECK(al_utf8_width(0x10ffff) == 4);

   /* These are illegal. */
   CHECK(al_utf8_width(0x110000) == 0);
   CHECK(al_utf8_width(0xffffff) == 0);
}